

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

Bigint * pow5mult(Bigint *b,int k)

{
  Bigint *pBVar1;
  Bigint *pBStack_38;
  int i;
  Bigint *p51;
  Bigint *p5;
  Bigint *b1;
  Bigint *pBStack_18;
  int k_local;
  Bigint *b_local;
  
  pBStack_18 = b;
  if ((k & 3U) != 0) {
    pBStack_18 = multadd(b,pow5mult::p05[(int)((k & 3U) - 1)],0);
  }
  b1._4_4_ = k >> 2;
  if (b1._4_4_ == 0) {
    b_local = pBStack_18;
  }
  else {
    p51 = TI0.P5s;
    if (TI0.P5s == (Bigint *)0x0) {
      p51 = i2b(0x271);
      TI0.P5s = p51;
      p51->next = (Bigint *)0x0;
    }
    while( true ) {
      if ((b1._4_4_ & 1) != 0) {
        pBVar1 = mult(pBStack_18,p51);
        Bfree(pBStack_18);
        pBStack_18 = pBVar1;
      }
      b1._4_4_ = (int)b1._4_4_ >> 1;
      if (b1._4_4_ == 0) break;
      pBStack_38 = p51->next;
      if (pBStack_38 == (Bigint *)0x0) {
        pBStack_38 = mult(p51,p51);
        p51->next = pBStack_38;
        pBStack_38->next = (Bigint *)0x0;
      }
      p51 = pBStack_38;
    }
    b_local = pBStack_18;
  }
  return b_local;
}

Assistant:

static Bigint *
pow5mult(Bigint *b, int k MTd)
{
	Bigint *b1, *p5, *p51;
#ifdef MULTIPLE_THREADS
	ThInfo *TI;
#endif
	int i;
	static int p05[3] = { 5, 25, 125 };

	if ((i = k & 3))
		b = multadd(b, p05[i-1], 0 MTa);

	if (!(k >>= 2))
		return b;
#ifdef  MULTIPLE_THREADS
	if (!(TI = *PTI))
		*PTI = TI = get_TI();
#endif
	if (!(p5 = p5s)) {
		/* first time */
#ifdef MULTIPLE_THREADS
		if (!(TI = *PTI))
			*PTI = TI = get_TI();
		if (TI == &TI0)
			ACQUIRE_DTOA_LOCK(1);
		if (!(p5 = p5s)) {
			p5 = p5s = i2b(625 MTa);
			p5->next = 0;
			}
		if (TI == &TI0)
			FREE_DTOA_LOCK(1);
#else
		p5 = p5s = i2b(625 MTa);
		p5->next = 0;
#endif
		}
	for(;;) {
		if (k & 1) {
			b1 = mult(b, p5 MTa);
			Bfree(b MTa);
			b = b1;
			}
		if (!(k >>= 1))
			break;
		if (!(p51 = p5->next)) {
#ifdef MULTIPLE_THREADS
			if (!TI && !(TI = *PTI))
				*PTI = TI = get_TI();
			if (TI == &TI0)
				ACQUIRE_DTOA_LOCK(1);
			if (!(p51 = p5->next)) {
				p51 = p5->next = mult(p5,p5 MTa);
				p51->next = 0;
				}
			if (TI == &TI0)
				FREE_DTOA_LOCK(1);
#else
			p51 = p5->next = mult(p5,p5);
			p51->next = 0;
#endif
			}
		p5 = p51;
		}
	return b;
	}